

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O3

void on_handshake_complete(h2o_socket_t *sock,char *err)

{
  h2o_iovec_t value;
  int iVar1;
  size_t sVar2;
  SSL_CIPHER *c;
  ulong uVar3;
  SSL_SESSION *pSVar4;
  uint uVar5;
  st_h2o_socket_ssl_t *psVar6;
  h2o_socket_cb UNRECOVERED_JUMPTABLE;
  st_h2o_evloop_socket_t *sock_1;
  
  psVar6 = sock->ssl;
  if (err == (char *)0x0) {
    if (psVar6->ptls == (ptls_t *)0x0) {
      c = SSL_get_current_cipher((SSL *)psVar6->ossl);
      uVar3 = SSL_CIPHER_get_id(c);
      sVar2 = 0x1d;
      if ((3 < (int)uVar3 + 0xfcffff64U) &&
         ((uVar5 = (int)uVar3 + 0xfcff3fd5, 5 < uVar5 || ((0x33U >> (uVar5 & 0x1f) & 1) == 0)))) {
        sVar2 = 0x20;
      }
    }
    else {
      sVar2 = ptls_get_record_overhead(psVar6->ptls);
    }
    psVar6 = sock->ssl;
    psVar6->record_overhead = sVar2;
  }
  if (psVar6->ossl != (SSL *)0x0) {
    iVar1 = SSL_is_server();
    psVar6 = sock->ssl;
    if ((iVar1 == 0) && ((psVar6->handshake).field_1.client.session_cache != (h2o_cache_t *)0x0)) {
      if ((err != (char *)0x0) && (h2o_socket_error_ssl_cert_name_mismatch != err)) {
        UNRECOVERED_JUMPTABLE = (psVar6->handshake).cb;
        (sock->_cb).write = (h2o_socket_cb)0x0;
        (psVar6->handshake).cb = (h2o_socket_cb)0x0;
        goto LAB_0012f36d;
      }
      pSVar4 = SSL_get1_session((SSL *)psVar6->ossl);
      psVar6 = sock->ssl;
      value.len = 1;
      value.base = (char *)pSVar4;
      h2o_cache_set((psVar6->handshake).field_1.client.session_cache,(sock[1].ssl)->record_overhead,
                    (psVar6->handshake).field_1.client.session_cache_key,
                    (psVar6->handshake).field_1.client.session_cache_key_hash,value);
      psVar6 = sock->ssl;
    }
  }
  UNRECOVERED_JUMPTABLE = (psVar6->handshake).cb;
  (sock->_cb).write = (h2o_socket_cb)0x0;
  (psVar6->handshake).cb = (h2o_socket_cb)0x0;
  if (err == (char *)0x0) {
    decode_ssl_input(sock);
  }
LAB_0012f36d:
  (*UNRECOVERED_JUMPTABLE)(sock,err);
  return;
}

Assistant:

static void on_handshake_complete(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_http1client_private_t *client = sock->data;

    h2o_timeout_unlink(&client->_timeout);

    if (err == NULL) {
        /* success */
    } else if (err == h2o_socket_error_ssl_cert_name_mismatch &&
               (SSL_CTX_get_verify_mode(client->super.ctx->ssl_ctx) & SSL_VERIFY_PEER) == 0) {
        /* peer verification skipped */
    } else {
        on_connect_error(client, err);
        return;
    }

    on_connection_ready(client);
}